

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atexit.c
# Opt level: O0

int dumb_atexit(_func_void *proc)

{
  DUMB_ATEXIT_PROC *pDVar1;
  _func_void *in_RDI;
  DUMB_ATEXIT_PROC *dap;
  DUMB_ATEXIT_PROC *local_18;
  int local_4;
  
  local_18 = dumb_atexit_proc;
  while( true ) {
    if (local_18 == (DUMB_ATEXIT_PROC *)0x0) {
      pDVar1 = (DUMB_ATEXIT_PROC *)malloc(0x10);
      if (pDVar1 == (DUMB_ATEXIT_PROC *)0x0) {
        local_4 = -1;
      }
      else {
        pDVar1->next = dumb_atexit_proc;
        pDVar1->proc = in_RDI;
        local_4 = 0;
        dumb_atexit_proc = pDVar1;
      }
      return local_4;
    }
    if (local_18->proc == in_RDI) break;
    local_18 = local_18->next;
  }
  return 0;
}

Assistant:

int dumb_atexit(void (*proc)(void))
{
	DUMB_ATEXIT_PROC *dap = dumb_atexit_proc;

	while (dap) {
		if (dap->proc == proc) return 0;
		dap = dap->next;
	}

	dap = malloc(sizeof(*dap));

	if (!dap)
		return -1;

	dap->next = dumb_atexit_proc;
	dap->proc = proc;
	dumb_atexit_proc = dap;

	return 0;
}